

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.c
# Opt level: O3

void A64SysRegMapper_toString(A64SysRegMapper *S,uint32_t Bits,_Bool *Valid,char *result)

{
  A64NamedImmMapper_Mapping *pAVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  _Bool isNeg;
  ulong uVar7;
  uint uVar8;
  
  lVar2 = 8;
  do {
    if (*(uint32_t *)((long)&SysRegPairs[0].Name + lVar2) == Bits) {
      *Valid = true;
      pcVar3 = *(char **)((long)&group_name_maps[1].name + lVar2);
      goto LAB_001c18e4;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x1d88);
  if (Bits == 0xff90) {
    *Valid = true;
    builtin_strncpy(result,"cpm_ioacc_ctl_el3",0x12);
  }
  else {
    if (S->NumInstPairs != 0) {
      pAVar1 = S->InstPairs;
      uVar8 = 1;
      uVar7 = 0;
      do {
        if (pAVar1[uVar7].Value == Bits) {
          *Valid = true;
          pcVar3 = pAVar1[uVar7].Name;
LAB_001c18e4:
          strcpy(result,pcVar3);
          return;
        }
        uVar7 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
      } while (uVar7 < S->NumInstPairs);
    }
    if ((~Bits & 0xc580) == 0) {
      uVar8 = Bits >> 0xb & 7;
      uVar7 = (ulong)uVar8;
      *Valid = true;
      pcVar3 = utostr(uVar7,SUB41(uVar8,0));
      isNeg = SUB81(uVar7,0);
      pcVar4 = utostr((ulong)(Bits >> 7 & 0xf),isNeg);
      pcVar5 = utostr((ulong)(Bits >> 3 & 0xf),isNeg);
      pcVar6 = utostr((ulong)(Bits & 7),isNeg);
      sprintf(result,"s3_%s_c%s_c%s_%s",pcVar3,pcVar4,pcVar5,pcVar6);
      (*cs_mem_free)(pcVar3);
      (*cs_mem_free)(pcVar4);
      (*cs_mem_free)(pcVar5);
      (*cs_mem_free)(pcVar6);
      return;
    }
    *Valid = false;
  }
  return;
}

Assistant:

void A64SysRegMapper_toString(A64SysRegMapper *S, uint32_t Bits, bool *Valid, char *result)
{
	int dummy;
	uint32_t Op0, Op1, CRn, CRm, Op2;
	char *Op1S, *CRnS, *CRmS, *Op2S;
	unsigned i;

	// First search the registers shared by all
	for (i = 0; i < ARR_SIZE(SysRegPairs); ++i) {
		if (SysRegPairs[i].Value == Bits) {
			*Valid = true;
			strcpy(result, SysRegPairs[i].Name);
			return;
		}
	}

	// Next search for target specific registers
	// if (FeatureBits & AArch64_ProcCyclone) {
	if (true) {
		for (i = 0; i < ARR_SIZE(CycloneSysRegPairs); ++i) {
			if (CycloneSysRegPairs[i].Value == Bits) {
				*Valid = true;
				strcpy(result, CycloneSysRegPairs[i].Name);
				return;
			}
		}
	}

	// Now try the instruction-specific registers (either read-only or
	// write-only).
	for (i = 0; i < S->NumInstPairs; ++i) {
		if (S->InstPairs[i].Value == Bits) {
			*Valid = true;
			strcpy(result, S->InstPairs[i].Name);
			return;
		}
	}

	Op0 = (Bits >> 14) & 0x3;
	Op1 = (Bits >> 11) & 0x7;
	CRn = (Bits >> 7) & 0xf;
	CRm = (Bits >> 3) & 0xf;
	Op2 = Bits & 0x7;

	// Only combinations matching: 11 xxx 1x11 xxxx xxx are valid for a generic
	// name.
	if (Op0 != 3 || (CRn != 11 && CRn != 15)) {
		*Valid = false;
		return;
	}

	//assert(Op0 == 3 && (CRn == 11 || CRn == 15) && "Invalid generic sysreg");

	*Valid = true;

	Op1S = utostr(Op1, false);
	CRnS = utostr(CRn, false);
	CRmS = utostr(CRm, false);
	Op2S = utostr(Op2, false);

	//printf("Op1S: %s, CRnS: %s, CRmS: %s, Op2S: %s\n", Op1S, CRnS, CRmS, Op2S);
	dummy = sprintf(result, "s3_%s_c%s_c%s_%s", Op1S, CRnS, CRmS, Op2S);
	(void)dummy;

	cs_mem_free(Op1S);
	cs_mem_free(CRnS);
	cs_mem_free(CRmS);
	cs_mem_free(Op2S);
}